

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

int ixmlNode_allowChildren(IXML_Node_conflict *nodeptr,IXML_Node_conflict *newChild)

{
  IXML_NODE_TYPE IVar1;
  int iVar2;
  
  if (newChild == (IXML_Node_conflict *)0x0) {
    __assert_fail("nodeptr != NULL && newChild != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/node.c",
                  0x1dc,"int ixmlNode_allowChildren(IXML_Node *, IXML_Node *)");
  }
  IVar1 = nodeptr->nodeType;
  iVar2 = 0;
  if (2 < IVar1 - eATTRIBUTE_NODE) {
    if (IVar1 == eDOCUMENT_NODE) {
      if (newChild->nodeType != eELEMENT_NODE) {
        return 0;
      }
    }
    else if (IVar1 == eELEMENT_NODE) {
      return (int)(newChild->nodeType != eDOCUMENT_NODE && newChild->nodeType != eATTRIBUTE_NODE);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int ixmlNode_allowChildren(
	/*! [in] The \b Node to check. */
	IXML_Node *nodeptr,
	/*! [in] The child \b Node to check. */
	IXML_Node *newChild)
{
	assert(nodeptr != NULL && newChild != NULL);

	switch (nodeptr->nodeType) {
	case eATTRIBUTE_NODE:
	case eTEXT_NODE:
	case eCDATA_SECTION_NODE:
		return 0;

	case eELEMENT_NODE:
		switch (newChild->nodeType) {
		case eATTRIBUTE_NODE:
		case eDOCUMENT_NODE:
			return 0;
		default:
			break;
		}
		break;

	case eDOCUMENT_NODE:
		switch (newChild->nodeType) {
		case eELEMENT_NODE:
			break;
		default:
			return 0;
		}
		break;

	default:
		break;
	}

	return 1;
}